

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrEventDataStartColocationAdvertisementCompleteMETA *value)

{
  bool bVar1;
  NextChainResult NVar2;
  XrResult XVar3;
  uint32_t in_stack_fffffffffffffd6c;
  string local_288;
  string local_268;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_210;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1f8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1e0;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  string error_message;
  
  XVar3 = XR_SUCCESS;
  if (value->type != XR_TYPE_EVENT_DATA_START_COLOCATION_ADVERTISEMENT_COMPLETE_META) {
    XVar3 = XR_ERROR_VALIDATION_FAILURE;
    InvalidStructureType
              (instance_info,command_name,objects_info,
               "XrEventDataStartColocationAdvertisementCompleteMETA",value->type,
               "VUID-XrEventDataStartColocationAdvertisementCompleteMETA-type-type",
               XR_TYPE_EVENT_DATA_START_COLOCATION_ADVERTISEMENT_COMPLETE_META,
               "XR_TYPE_EVENT_DATA_START_COLOCATION_ADVERTISEMENT_COMPLETE_META");
  }
  if (!check_pnext) goto LAB_001bad1d;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  NVar2 = ValidateNextChain(instance_info,command_name,objects_info,value->next,&valid_ext_structs,
                            &encountered_structs,&duplicate_ext_structs);
  if (NVar2 == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
    std::__cxx11::string::string
              ((string *)&error_message,
               "Multiple structures of the same type(s) in \"next\" chain for ",
               (allocator *)&local_288);
    std::__cxx11::string::append((char *)&error_message);
    StructTypesToString_abi_cxx11_(&local_288,instance_info,&duplicate_ext_structs);
    std::__cxx11::string::append((string *)&error_message);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::string
              ((string *)&local_288,
               "VUID-XrEventDataStartColocationAdvertisementCompleteMETA-next-unique",
               (allocator *)&stack0xfffffffffffffd6e);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1f8,objects_info);
    std::__cxx11::string::string
              ((string *)&local_268,
               "Multiple structures of the same type(s) in \"next\" chain for XrEventDataStartColocationAdvertisementCompleteMETA struct"
               ,(allocator *)&stack0xfffffffffffffd6f);
    CoreValidLogMessage(instance_info,&local_288,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1f8,&local_268);
    std::__cxx11::string::~string((string *)&local_268);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1f8);
    std::__cxx11::string::~string((string *)&local_288);
LAB_001baceb:
    std::__cxx11::string::~string((string *)&error_message);
    XVar3 = XR_ERROR_VALIDATION_FAILURE;
  }
  else if (NVar2 == NEXT_CHAIN_RESULT_ERROR) {
    std::__cxx11::string::string
              ((string *)&error_message,
               "VUID-XrEventDataStartColocationAdvertisementCompleteMETA-next-next",
               (allocator *)&local_268);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1e0,objects_info);
    std::__cxx11::string::string
              ((string *)&local_288,
               "Invalid structure(s) in \"next\" chain for XrEventDataStartColocationAdvertisementCompleteMETA struct \"next\""
               ,(allocator *)&stack0xfffffffffffffd6e);
    CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1e0,&local_288);
    std::__cxx11::string::~string((string *)&local_288);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1e0);
    goto LAB_001baceb;
  }
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&encountered_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&duplicate_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&valid_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
LAB_001bad1d:
  if (check_members && XVar3 == XR_SUCCESS) {
    std::__cxx11::string::string
              ((string *)&error_message,"XrEventDataStartColocationAdvertisementCompleteMETA",
               (allocator *)&local_268);
    std::__cxx11::string::string((string *)&local_288,"result",(allocator *)&valid_ext_structs);
    bVar1 = ValidateXrEnum(instance_info,command_name,&error_message,&local_288,objects_info,
                           value->result);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&error_message);
    XVar3 = XR_SUCCESS;
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
      std::operator<<((ostream *)&error_message,
                      "XrEventDataStartColocationAdvertisementCompleteMETA contains invalid XrResult \"result\" enum value "
                     );
      Uint32ToHexString_abi_cxx11_(in_stack_fffffffffffffd6c);
      std::operator<<((ostream *)&error_message,(string *)&local_288);
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::string
                ((string *)&local_288,
                 "VUID-XrEventDataStartColocationAdvertisementCompleteMETA-result-parameter",
                 (allocator *)&valid_ext_structs);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_210,objects_info);
      std::__cxx11::stringbuf::str();
      CoreValidLogMessage(instance_info,&local_288,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_210,&local_268);
      std::__cxx11::string::~string((string *)&local_268);
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(&local_210);
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
      XVar3 = XR_ERROR_VALIDATION_FAILURE;
    }
  }
  return XVar3;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrEventDataStartColocationAdvertisementCompleteMETA* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_EVENT_DATA_START_COLOCATION_ADVERTISEMENT_COMPLETE_META) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrEventDataStartColocationAdvertisementCompleteMETA",
                             value->type, "VUID-XrEventDataStartColocationAdvertisementCompleteMETA-type-type", XR_TYPE_EVENT_DATA_START_COLOCATION_ADVERTISEMENT_COMPLETE_META, "XR_TYPE_EVENT_DATA_START_COLOCATION_ADVERTISEMENT_COMPLETE_META");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrEventDataStartColocationAdvertisementCompleteMETA-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrEventDataStartColocationAdvertisementCompleteMETA struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrEventDataStartColocationAdvertisementCompleteMETA : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrEventDataStartColocationAdvertisementCompleteMETA-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrEventDataStartColocationAdvertisementCompleteMETA struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Make sure the enum type XrResult value is valid
    if (!ValidateXrEnum(instance_info, command_name, "XrEventDataStartColocationAdvertisementCompleteMETA", "result", objects_info, value->result)) {
        std::ostringstream oss_enum;
        oss_enum << "XrEventDataStartColocationAdvertisementCompleteMETA contains invalid XrResult \"result\" enum value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->result));
        CoreValidLogMessage(instance_info, "VUID-XrEventDataStartColocationAdvertisementCompleteMETA-result-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Everything checked out properly
    return xr_result;
}